

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O0

ts_nsec ts_diff(ts_nsec start,ts_nsec end)

{
  ts_nsec diff;
  ts_nsec end_local;
  ts_nsec start_local;
  
  if (end - start < 0) {
    diff = (end + 1000000000) - start;
  }
  else {
    diff = end - start;
  }
  return diff / 1000;
}

Assistant:

ts_nsec ts_diff(ts_nsec start, ts_nsec end)
{
    ts_nsec diff = 0;
    if ((end-start)<0) {
        diff  = 1000000000+end-start;
    } else {
        diff = end-start;
    }
    return diff/1000;
}